

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_refs.c
# Opt level: O3

int refs_modify(refs_table_t *tbl,uint64_t a,int dir)

{
  ulong uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  ulong *puVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  
  uVar6 = ((a >> 0x27 | a << 0x19) ^ (a ^ 0xcbf29ce484222325) * 0x100000001b3) * 0x100000001b3;
  do {
    do {
      while (uVar2 = tbl->refs_control, 0xfffffff < uVar2) {
        do {
          iVar9 = refs_resize_help(tbl);
        } while (iVar9 != 0);
      }
      LOCK();
      bVar12 = uVar2 == tbl->refs_control;
      if (bVar12) {
        tbl->refs_control = uVar2 + 1;
      }
      UNLOCK();
    } while (!bVar12);
LAB_0012b079:
    iVar9 = 0x7f;
    puVar7 = (ulong *)0x0;
    puVar8 = tbl->refs_table + (tbl->refs_size - 1 & (uVar6 >> 0x20 ^ uVar6));
    do {
      while (uVar5 = *puVar8, uVar5 == 0) {
        if (dir < 0) goto LAB_0012b165;
        uVar5 = 0x7fffffffffffffff;
        if (puVar7 == (ulong *)0x0) {
          uVar5 = 0;
          puVar7 = puVar8;
        }
        puVar8 = puVar7;
        puVar7 = (ulong *)0x0;
        uVar10 = a | 0x10000000000;
LAB_0012b0f2:
        LOCK();
        uVar1 = *puVar8;
        if (uVar5 == uVar1) {
          *puVar8 = uVar10;
        }
        UNLOCK();
        if (uVar5 == uVar1) goto LAB_0012b165;
      }
      if (uVar5 == 0x7fffffffffffffff) {
        if (puVar7 == (ulong *)0x0) {
          puVar7 = puVar8;
        }
      }
      else if ((uVar5 & 0xffffffffff) == a) {
        if (uVar5 >> 0x28 != 0x7fffff) {
          lVar11 = (uVar5 >> 0x28) + (long)dir;
          uVar10 = lVar11 << 0x28 | a;
          if (lVar11 == 0) {
            uVar10 = 0x7fffffffffffffff;
          }
          goto LAB_0012b0f2;
        }
        goto LAB_0012b165;
      }
      puVar8 = puVar8 + 1;
      if (puVar8 == tbl->refs_table + tbl->refs_size) {
        puVar8 = tbl->refs_table;
      }
      bVar12 = iVar9 != 0;
      iVar9 = iVar9 + -1;
    } while (bVar12);
    if (dir < 0) goto LAB_0012b165;
    if (puVar7 != (ulong *)0x0) break;
    do {
      uVar4 = tbl->refs_control;
      LOCK();
      bVar12 = uVar4 == tbl->refs_control;
      if (bVar12) {
        tbl->refs_control = uVar4 - 1;
      }
      UNLOCK();
    } while (!bVar12);
    refs_resize(tbl);
  } while( true );
  LOCK();
  uVar5 = *puVar7;
  if (uVar5 == 0x7fffffffffffffff) {
    *puVar7 = a | 0x10000000000;
  }
  UNLOCK();
  if (uVar5 == 0x7fffffffffffffff) {
LAB_0012b165:
    do {
      uVar3 = tbl->refs_control;
      LOCK();
      uVar4 = tbl->refs_control;
      bVar12 = uVar3 == uVar4;
      if (bVar12) {
        tbl->refs_control = uVar3 - 1;
        uVar4 = uVar3;
      }
      UNLOCK();
    } while (!bVar12);
    return uVar4;
  }
  goto LAB_0012b079;
}

Assistant:

static inline int
refs_modify(refs_table_t *tbl, const uint64_t a, const int dir)
{
    _Atomic(uint64_t)* bucket;
    _Atomic(uint64_t)* ts_bucket;
    uint64_t v, new_v;
    int res, i;

    refs_enter(tbl);

ref_retry:
    bucket = tbl->refs_table + (fnvhash8(a) & (tbl->refs_size - 1));
    ts_bucket = NULL; // tombstone
    i = 128; // try 128 times linear probing

    while (i--) {
ref_restart:
        v = *bucket;
        if (v == refs_ts) {
            if (ts_bucket == NULL) ts_bucket = bucket;
        } else if (v == 0) {
            // not found
            res = 0;
            if (dir < 0) goto ref_exit;
            if (ts_bucket != NULL) {
                bucket = ts_bucket;
                ts_bucket = NULL;
                v = refs_ts;
            }
            new_v = a | (1ULL << 40);
            goto ref_mod;
        } else if ((v & 0x000000ffffffffff) == a) {
            // found
            res = 1;
            uint64_t count = v >> 40;
            if (count == 0x7fffff) goto ref_exit;
            count += dir;
            if (count == 0) new_v = refs_ts;
            else new_v = a | (count << 40);
            goto ref_mod;
        }

        if (++bucket == tbl->refs_table + tbl->refs_size) bucket = tbl->refs_table;
    }

    // not found after linear probing
    if (dir < 0) {
        res = 0;
        goto ref_exit;
    } else if (ts_bucket != NULL) {
        bucket = ts_bucket;
        ts_bucket = NULL;
        v = refs_ts;
        new_v = a | (1ULL << 40);
        if (!atomic_compare_exchange_weak(bucket, &v, new_v)) goto ref_retry;
        res = 1;
        goto ref_exit;
    } else {
        // hash table full
        refs_leave(tbl);
        refs_resize(tbl);
        return refs_modify(tbl, a, dir);
    }

ref_mod:
    if (!atomic_compare_exchange_weak(bucket, &v, new_v)) goto ref_restart;

ref_exit:
    refs_leave(tbl);
    return res;
}